

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_18c56::OpenGLGraphicsPlugin::CheckShader
          (OpenGLGraphicsPlugin *this,GLuint shader)

{
  string local_1040 [36];
  GLsizei local_101c;
  GLchar local_1018 [4];
  GLsizei length;
  GLchar msg [4096];
  GLint r;
  GLuint shader_local;
  OpenGLGraphicsPlugin *this_local;
  
  msg[0xff8] = '\0';
  msg[0xff9] = '\0';
  msg[0xffa] = '\0';
  msg[0xffb] = '\0';
  msg._4092_4_ = shader;
  (*glGetShaderiv)(shader,0x8b81,(GLint *)(msg + 0xff8));
  if (msg._4088_4_ == 0) {
    memset(local_1018,0,0x1000);
    (*glGetShaderInfoLog)(msg._4092_4_,0x1000,&local_101c,local_1018);
    Fmt_abi_cxx11_((char *)local_1040,"Compile shader failed: %s",local_1018);
    Throw(local_1040,(char *)0x0,
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:216"
         );
  }
  return;
}

Assistant:

void CheckShader(GLuint shader) {
        GLint r = 0;
        glGetShaderiv(shader, GL_COMPILE_STATUS, &r);
        if (r == GL_FALSE) {
            GLchar msg[4096] = {};
            GLsizei length;
            glGetShaderInfoLog(shader, sizeof(msg), &length, msg);
            THROW(Fmt("Compile shader failed: %s", msg));
        }
    }